

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidx_manager.c
# Opt level: O3

int write_cidx(int offset,opj_cio_t *cio,opj_image_t *image,opj_codestream_info_t cstr_info,
              int j2klen)

{
  bool bVar1;
  bool bVar2;
  int pos;
  OPJ_UINT32 OVar3;
  opj_bool EPHused;
  int pos_00;
  opj_jp2_box_t *box;
  long lVar4;
  int v;
  opj_codestream_info_t *poVar5;
  double *pdVar6;
  int second;
  byte bVar7;
  opj_codestream_info_t in_stack_ffffffffffffff48;
  
  bVar7 = 0;
  box = (opj_jp2_box_t *)calloc(0x20,0xc);
  pos = -1;
  v = 0;
  second = 0;
  bVar2 = true;
  do {
    bVar1 = bVar2;
    if (!bVar1) {
      cio_seek(cio,pos);
    }
    pos = cio_tell(cio);
    cio_skip(cio,4);
    cio_write(cio,0x63696478,4);
    write_cptr(offset,cstr_info.codestream_size,cio);
    write_manf(second,v,box,cio);
    poVar5 = &cstr_info;
    pdVar6 = (double *)&stack0xffffffffffffff48;
    for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
      *pdVar6 = poVar5->D_max;
      poVar5 = (opj_codestream_info_t *)((long)poVar5 + (ulong)bVar7 * -0x10 + 8);
      pdVar6 = pdVar6 + (ulong)bVar7 * -2 + 1;
    }
    OVar3 = write_mainmhix(offset,in_stack_ffffffffffffff48,cio);
    box->length = OVar3;
    box->type = 0x6d686978;
    poVar5 = &cstr_info;
    pdVar6 = (double *)&stack0xffffffffffffff48;
    for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
      *pdVar6 = poVar5->D_max;
      poVar5 = (opj_codestream_info_t *)((long)poVar5 + (ulong)bVar7 * -0x10 + 8);
      pdVar6 = pdVar6 + (ulong)bVar7 * -2 + 1;
    }
    OVar3 = write_tpix(offset,in_stack_ffffffffffffff48,j2klen,cio);
    box[1].length = OVar3;
    box[1].type = 0x74706978;
    poVar5 = &cstr_info;
    pdVar6 = (double *)&stack0xffffffffffffff48;
    for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
      *pdVar6 = poVar5->D_max;
      poVar5 = (opj_codestream_info_t *)((long)poVar5 + (ulong)bVar7 * -0x10 + 8);
      pdVar6 = pdVar6 + (ulong)bVar7 * -2 + 1;
    }
    OVar3 = write_thix(offset,in_stack_ffffffffffffff48,cio);
    box[2].length = OVar3;
    box[2].type = 0x74686978;
    EPHused = check_EPHuse(offset,cstr_info.marker,cstr_info.marknum,cio);
    poVar5 = &cstr_info;
    pdVar6 = (double *)&stack0xffffffffffffff48;
    for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
      *pdVar6 = poVar5->D_max;
      poVar5 = (opj_codestream_info_t *)((long)poVar5 + (ulong)bVar7 * -0x10 + 8);
      pdVar6 = pdVar6 + (ulong)bVar7 * -2 + 1;
    }
    OVar3 = write_ppix(offset,in_stack_ffffffffffffff48,EPHused,j2klen,cio);
    box[3].length = OVar3;
    box[3].type = 0x70706978;
    poVar5 = &cstr_info;
    pdVar6 = (double *)&stack0xffffffffffffff48;
    for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
      *pdVar6 = poVar5->D_max;
      poVar5 = (opj_codestream_info_t *)((long)poVar5 + (ulong)bVar7 * -0x10 + 8);
      pdVar6 = pdVar6 + (ulong)bVar7 * -2 + 1;
    }
    OVar3 = write_phix(offset,in_stack_ffffffffffffff48,EPHused,j2klen,cio);
    box[4].length = OVar3;
    box[4].type = 0x70686978;
    pos_00 = cio_tell(cio);
    cio_seek(cio,pos);
    cio_write(cio,(long)(pos_00 - pos),4);
    cio_seek(cio,pos_00);
    second = 1;
    v = 5;
    bVar2 = false;
  } while (bVar1);
  free(box);
  return pos_00 - pos;
}

Assistant:

int write_cidx( int offset, opj_cio_t *cio, opj_image_t *image, opj_codestream_info_t cstr_info, int j2klen)
{
  int len, i, lenp;
  opj_jp2_box_t *box;
  int num_box = 0;
  opj_bool  EPHused;
  (void)image; /* unused ? */

  lenp = -1;
  box = (opj_jp2_box_t *)opj_calloc( 32, sizeof(opj_jp2_box_t));

  for (i=0;i<2;i++){
  
    if(i)
      cio_seek( cio, lenp);

    lenp = cio_tell( cio);

    cio_skip( cio, 4);              /* L [at the end] */
    cio_write( cio, JPIP_CIDX, 4);  /* CIDX           */
    write_cptr( offset, cstr_info.codestream_size, cio);

    write_manf( i, num_box, box, cio);
    
    num_box = 0;
    box[num_box].length = write_mainmhix( offset, cstr_info, cio);
    box[num_box].type = JPIP_MHIX;
    num_box++;

    box[num_box].length = write_tpix( offset, cstr_info, j2klen, cio);
    box[num_box].type = JPIP_TPIX;
    num_box++;
      
    box[num_box].length = write_thix( offset, cstr_info, cio);
    box[num_box].type = JPIP_THIX;
    num_box++;

    EPHused = check_EPHuse( offset, cstr_info.marker, cstr_info.marknum, cio);
      
    box[num_box].length = write_ppix( offset, cstr_info, EPHused, j2klen, cio);
    box[num_box].type = JPIP_PPIX;
    num_box++;
    
    box[num_box].length = write_phix( offset, cstr_info, EPHused, j2klen, cio);
    box[num_box].type = JPIP_PHIX;
    num_box++;
      
    len = cio_tell( cio)-lenp;
    cio_seek( cio, lenp);
    cio_write( cio, len, 4);        /* L             */
    cio_seek( cio, lenp+len);
  }

  opj_free( box);
  
  return len;
}